

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_trcddi.cpp
# Opt level: O0

ze_result_t
tracing_layer::zeFabricEdgeGetExp
          (ze_fabric_vertex_handle_t hVertexA,ze_fabric_vertex_handle_t hVertexB,uint32_t *pCount,
          ze_fabric_edge_handle_t *phEdges)

{
  _func_void__ze_fabric_edge_get_exp_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr *p_Var1;
  _func__ze_result_t__ze_fabric_vertex_handle_t_ptr__ze_fabric_vertex_handle_t_ptr_uint_ptr__ze_fabric_edge_handle_t_ptr_ptr
  *zeApiPtr;
  char *pcVar2;
  undefined1 *puVar3;
  ulong *puVar4;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_110;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_f8;
  undefined1 local_e0 [8];
  APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_exp_params_t_*,__ze_result_t,_void_*,_void_**)>
  epilogCallback;
  APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_exp_params_t_*,__ze_result_t,_void_*,_void_**)>
  prologCallback;
  ze_pfnFabricEdgeGetExpCb_t epilogue_callback_ptr;
  ze_pfnFabricEdgeGetExpCb_t prologueCallbackPtr;
  size_t i;
  tracer_array_t *currentTracerArray;
  APITracerCallbackDataImp<void_(*)(_ze_fabric_edge_get_exp_params_t_*,__ze_result_t,_void_*,_void_**)>
  apiCallbackData;
  ze_fabric_edge_get_exp_params_t tracerParams;
  ze_pfnFabricEdgeGetExp_t pfnGetExp;
  ze_fabric_edge_handle_t *phEdges_local;
  uint32_t *pCount_local;
  ze_fabric_vertex_handle_t hVertexB_local;
  ze_fabric_vertex_handle_t hVertexA_local;
  
  if (_DAT_002da880 ==
      (_func__ze_result_t__ze_fabric_vertex_handle_t_ptr__ze_fabric_vertex_handle_t_ptr_uint_ptr__ze_fabric_edge_handle_t_ptr_ptr
       *)0x0) {
    hVertexA_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    pfnGetExp = (ze_pfnFabricEdgeGetExp_t)phEdges;
    phEdges_local = (ze_fabric_edge_handle_t *)pCount;
    pCount_local = (uint32_t *)hVertexB;
    hVertexB_local = hVertexA;
    pcVar2 = (char *)tracingInProgress();
    if (*pcVar2 == '\0') {
      puVar3 = (undefined1 *)tracingInProgress();
      *puVar3 = 1;
      apiCallbackData.epilogCallbacks.
      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&hVertexB_local;
      APITracerCallbackDataImp<void_(*)(_ze_fabric_edge_get_exp_params_t_*,__ze_result_t,_void_*,_void_**)>
      ::APITracerCallbackDataImp
                ((APITracerCallbackDataImp<void_(*)(_ze_fabric_edge_get_exp_params_t_*,__ze_result_t,_void_*,_void_**)>
                  *)&currentTracerArray);
      puVar4 = (ulong *)(**(code **)(*pGlobalAPITracerContextImp + 0x10))();
      if (puVar4 != (ulong *)0x0) {
        for (prologueCallbackPtr = (ze_pfnFabricEdgeGetExpCb_t)0x0;
            prologueCallbackPtr < (ze_pfnFabricEdgeGetExpCb_t)*puVar4;
            prologueCallbackPtr = prologueCallbackPtr + 1) {
          epilogCallback.pUserData =
               *(void **)(puVar4[1] + (long)prologueCallbackPtr * 0xcb8 + 0x620);
          p_Var1 = *(_func_void__ze_fabric_edge_get_exp_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                     **)(puVar4[1] + (long)prologueCallbackPtr * 0xcb8 + 0xc78);
          std::
          vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ::push_back((vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                       *)&apiCallbackData,(value_type *)&epilogCallback.pUserData);
          epilogCallback.current_api_callback =
               *(_func_void__ze_fabric_edge_get_exp_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                 **)(puVar4[1] + 0xcb0 + (long)prologueCallbackPtr * 0xcb8);
          local_e0 = (undefined1  [8])p_Var1;
          std::
          vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ::push_back((vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                       *)&apiCallbackData.prologCallbacks.
                          super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_e0)
          ;
        }
      }
      zeApiPtr = _DAT_002da880;
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::vector(&local_f8,
               (vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                *)&apiCallbackData);
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::vector(&local_110,
               (vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                *)&apiCallbackData.prologCallbacks.
                   super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      hVertexA_local._4_4_ =
           APITracerWrapperImp<_ze_result_t(*)(_ze_fabric_vertex_handle_t*,_ze_fabric_vertex_handle_t*,unsigned_int*,_ze_fabric_edge_handle_t**),_ze_fabric_edge_get_exp_params_t*,void(*)(_ze_fabric_edge_get_exp_params_t*,_ze_result_t,void*,void**),std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_fabric_edge_get_exp_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_fabric_edge_get_exp_params_t*,_ze_result_t,void*,void**)>>>,std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_fabric_edge_get_exp_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_fabric_edge_get_exp_params_t*,_ze_result_t,void*,void**)>>>,_ze_fabric_vertex_handle_t*&,_ze_fabric_vertex_handle_t*&,unsigned_int*&,_ze_fabric_edge_handle_t**&>
                     (zeApiPtr,(_ze_fabric_edge_get_exp_params_t *)
                               &apiCallbackData.epilogCallbacks.
                                super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (_func_void__ze_fabric_edge_get_exp_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                       *)currentTracerArray,&local_f8,&local_110,
                      (_ze_fabric_vertex_handle_t **)
                      apiCallbackData.epilogCallbacks.
                      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (_ze_fabric_vertex_handle_t **)&pCount_local,(uint **)&phEdges_local,
                      (_ze_fabric_edge_handle_t ***)&pfnGetExp);
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::~vector(&local_110);
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_fabric_edge_get_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::~vector(&local_f8);
      APITracerCallbackDataImp<void_(*)(_ze_fabric_edge_get_exp_params_t_*,__ze_result_t,_void_*,_void_**)>
      ::~APITracerCallbackDataImp
                ((APITracerCallbackDataImp<void_(*)(_ze_fabric_edge_get_exp_params_t_*,__ze_result_t,_void_*,_void_**)>
                  *)&currentTracerArray);
    }
    else {
      hVertexA_local._4_4_ =
           (*_DAT_002da880)(hVertexB_local,(_ze_fabric_vertex_handle_t *)pCount_local,
                            (uint *)phEdges_local,(_ze_fabric_edge_handle_t **)pfnGetExp);
    }
  }
  return hVertexA_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeFabricEdgeGetExp(
        ze_fabric_vertex_handle_t hVertexA,             ///< [in] handle of first fabric vertex instance
        ze_fabric_vertex_handle_t hVertexB,             ///< [in] handle of second fabric vertex instance
        uint32_t* pCount,                               ///< [in,out] pointer to the number of fabric edges.
                                                        ///< if count is zero, then the driver shall update the value with the
                                                        ///< total number of fabric edges available.
                                                        ///< if count is greater than the number of fabric edges available, then
                                                        ///< the driver shall update the value with the correct number of fabric
                                                        ///< edges available.
        ze_fabric_edge_handle_t* phEdges                ///< [in,out][optional][range(0, *pCount)] array of handle of fabric edges.
                                                        ///< if count is less than the number of fabric edges available, then
                                                        ///< driver shall only retrieve that number of fabric edges.
        )
    {
        auto pfnGetExp = context.zeDdiTable.FabricEdgeExp.pfnGetExp;

        if( nullptr == pfnGetExp)
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;

        ZE_HANDLE_TRACER_RECURSION(context.zeDdiTable.FabricEdgeExp.pfnGetExp, hVertexA, hVertexB, pCount, phEdges);

        // capture parameters
        ze_fabric_edge_get_exp_params_t tracerParams = {
            &hVertexA,
            &hVertexB,
            &pCount,
            &phEdges
        };

        tracing_layer::APITracerCallbackDataImp<ze_pfnFabricEdgeGetExpCb_t> apiCallbackData;

        ZE_GEN_PER_API_CALLBACK_STATE(apiCallbackData, ze_pfnFabricEdgeGetExpCb_t, FabricEdge, pfnGetExpCb);


        return tracing_layer::APITracerWrapperImp(context.zeDdiTable.FabricEdgeExp.pfnGetExp,
                                                  &tracerParams,
                                                  apiCallbackData.apiOrdinal,
                                                  apiCallbackData.prologCallbacks,
                                                  apiCallbackData.epilogCallbacks,
                                                  *tracerParams.phVertexA,
                                                  *tracerParams.phVertexB,
                                                  *tracerParams.ppCount,
                                                  *tracerParams.pphEdges);
    }